

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_highbd_inv_txfm_add_16x4_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  int eob;
  TX_SIZE tx_size;
  TX_TYPE tx_type;
  int bd;
  int in_stack_0000023c;
  TX_SIZE in_stack_00000242;
  TX_TYPE in_stack_00000243;
  int in_stack_00000244;
  uint16_t *in_stack_00000248;
  int32_t *in_stack_00000250;
  int in_stack_00000260;
  
  highbd_inv_txfm2d_add_16x4_sse4_1
            (in_stack_00000250,in_stack_00000248,in_stack_00000244,in_stack_00000243,
             in_stack_00000242,in_stack_0000023c,in_stack_00000260);
  return;
}

Assistant:

static void av1_highbd_inv_txfm_add_16x4_sse4_1(const tran_low_t *input,
                                                uint8_t *dest, int stride,
                                                const TxfmParam *txfm_param) {
  int bd = txfm_param->bd;
  const TX_TYPE tx_type = txfm_param->tx_type;
  const TX_SIZE tx_size = txfm_param->tx_size;
  int eob = txfm_param->eob;
  highbd_inv_txfm2d_add_16x4_sse4_1(input, CONVERT_TO_SHORTPTR(dest), stride,
                                    tx_type, tx_size, eob, bd);
}